

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O0

base_learner * mwt_setup(options_i *options,vw *all)

{
  policy_data *ppVar1;
  ulong uVar2;
  vw *pvVar3;
  long *plVar4;
  byte bVar5;
  ulong uVar6;
  pointer pmVar7;
  byte *pbVar8;
  policy_data **pppVar9;
  size_t sVar10;
  vw *in_RSI;
  long *in_RDI;
  learner<MWT::mwt,_example> *l;
  stringstream ss;
  size_t i;
  option_group_definition new_options;
  bool exclude_eval;
  string s;
  free_ptr<MWT::mwt> c;
  undefined4 in_stack_fffffffffffff6f8;
  prediction_type_t in_stack_fffffffffffff6fc;
  vw *in_stack_fffffffffffff700;
  string *in_stack_fffffffffffff708;
  single_learner *in_stack_fffffffffffff710;
  base_learner *in_stack_fffffffffffff718;
  learner<MWT::mwt,_example> *in_stack_fffffffffffff720;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff748;
  option_group_definition *in_stack_fffffffffffff750;
  learner<MWT::mwt,_example> *local_7a0;
  string local_798 [39];
  allocator local_771;
  string local_770 [32];
  stringstream local_750 [16];
  learner<char,_char> *in_stack_fffffffffffff8c0;
  allocator local_5c1;
  string local_5c0 [32];
  ulong local_5a0;
  undefined4 local_598;
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [359];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [359];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200 [2];
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [63];
  byte local_49;
  string local_48 [48];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<MWT::mwt>();
  std::__cxx11::string::string(local_48);
  local_49 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Multiworld Testing Options",&local_a9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff700,
             (string *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"multiworld_test",&local_221);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff708,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff700);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_200,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"Evaluate features as a policies",&local_249);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff700,
       (string *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff700,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"learn",&local_3b1);
  std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
            ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21cf13);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff708,(uint *)in_stack_fffffffffffff700)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"Do Contextual Bandit learning on <n> classes.",&local_3d9)
  ;
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff700,
             (string *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff700,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff750,(typed_option<unsigned_int> *)in_stack_fffffffffffff748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"exclude_eval",&local_541);
  VW::config::make_option<bool>(in_stack_fffffffffffff708,(bool *)in_stack_fffffffffffff700);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"Discard mwt policy features before learning",&local_569);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff700,
             (string *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff700,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff750,(typed_option<bool> *)in_stack_fffffffffffff748);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  (**(code **)*local_10)(local_10,local_88);
  plVar4 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"multiworld_test",&local_591);
  bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_590);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  if (((bVar5 ^ 0xff) & 1) == 0) {
    for (local_5a0 = 0; uVar2 = local_5a0, uVar6 = std::__cxx11::string::size(), pvVar3 = local_18,
        uVar2 < uVar6; local_5a0 = local_5a0 + 1) {
      pmVar7 = std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
                         ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d5af);
      pbVar8 = (byte *)std::__cxx11::string::operator[]((ulong)local_48);
      pmVar7->namespaces[*pbVar8] = true;
    }
    pmVar7 = std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
                       ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d62b);
    pmVar7->all = pvVar3;
    std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
              ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d647);
    vw::length(local_18);
    calloc_reserve<MWT::policy_data>
              ((v_array<MWT::policy_data> *)in_stack_fffffffffffff700,
               CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    pmVar7 = std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
                       ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d690);
    pppVar9 = v_array<MWT::policy_data>::begin(&pmVar7->evals);
    ppVar1 = *pppVar9;
    sVar10 = vw::length(local_18);
    pmVar7 = std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
                       ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d6ff);
    pppVar9 = v_array<MWT::policy_data>::end(&pmVar7->evals);
    *pppVar9 = ppVar1 + sVar10;
    local_18->delete_prediction = delete_scalars;
    memcpy(&local_18->p->lp,&CB::cb_label,0x48);
    local_18->label_type = cb;
    pmVar7 = std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
                       ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d784);
    if (pmVar7->num_classes != 0) {
      pmVar7 = std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
                         ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d79e);
      plVar4 = local_10;
      pmVar7->learn = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c0,"cb",&local_5c1);
      bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_5c0);
      std::__cxx11::string::~string(local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
      if (((bVar5 ^ 0xff) & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_750);
        pmVar7 = std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
                           ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d85b);
        std::ostream::operator<<(&stack0xfffffffffffff8c0,pmVar7->num_classes);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_770,"cb",&local_771);
        std::__cxx11::stringstream::str();
        (**(code **)(*local_10 + 0x28))(local_10,local_770,local_798);
        std::__cxx11::string::~string(local_798);
        std::__cxx11::string::~string(local_770);
        std::allocator<char>::~allocator((allocator<char> *)&local_771);
        std::__cxx11::stringstream::~stringstream(local_750);
      }
    }
    pmVar7 = std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::operator->
                       ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)0x21d9fe);
    if ((pmVar7->learn & 1U) == 0) {
      in_stack_fffffffffffff718 =
           setup_base((options_i *)in_stack_fffffffffffff708,in_stack_fffffffffffff700);
      in_stack_fffffffffffff710 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffff8c0);
      local_7a0 = LEARNER::init_learner<MWT::mwt,example,LEARNER::learner<char,example>>
                            ((free_ptr<MWT::mwt> *)in_stack_fffffffffffff720,
                             (learner<char,_example> *)in_stack_fffffffffffff718,
                             (_func_void_mwt_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff710,
                             (_func_void_mwt_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff708,(size_t)in_stack_fffffffffffff700,
                             in_stack_fffffffffffff6fc);
    }
    else if ((local_49 & 1) == 0) {
      setup_base((options_i *)in_stack_fffffffffffff708,in_stack_fffffffffffff700);
      LEARNER::as_singleline<char,char>(in_stack_fffffffffffff8c0);
      in_stack_fffffffffffff720 =
           LEARNER::init_learner<MWT::mwt,example,LEARNER::learner<char,example>>
                     ((free_ptr<MWT::mwt> *)in_stack_fffffffffffff720,
                      (learner<char,_example> *)in_stack_fffffffffffff718,
                      (_func_void_mwt_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff710,
                      (_func_void_mwt_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff708,(size_t)in_stack_fffffffffffff700,
                      in_stack_fffffffffffff6fc);
      local_7a0 = in_stack_fffffffffffff720;
    }
    else {
      setup_base((options_i *)in_stack_fffffffffffff708,in_stack_fffffffffffff700);
      LEARNER::as_singleline<char,char>(in_stack_fffffffffffff8c0);
      local_7a0 = LEARNER::init_learner<MWT::mwt,example,LEARNER::learner<char,example>>
                            ((free_ptr<MWT::mwt> *)in_stack_fffffffffffff720,
                             (learner<char,_example> *)in_stack_fffffffffffff718,
                             (_func_void_mwt_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff710,
                             (_func_void_mwt_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff708,(size_t)in_stack_fffffffffffff700,
                             in_stack_fffffffffffff6fc);
    }
    LEARNER::learner<MWT::mwt,_example>::set_save_load(local_7a0,MWT::save_load);
    LEARNER::learner<MWT::mwt,_example>::set_finish_example(local_7a0,MWT::finish_example);
    LEARNER::learner<MWT::mwt,_example>::set_finish
              (in_stack_fffffffffffff720,(_func_void_mwt_ptr *)in_stack_fffffffffffff718);
    in_stack_fffffffffffff700 = (vw *)LEARNER::make_base<MWT::mwt,example>(local_7a0);
    local_8 = in_stack_fffffffffffff700;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_598 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff700);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<MWT::mwt,_void_(*)(void_*)> *)in_stack_fffffffffffff710);
  return (base_learner *)local_8;
}

Assistant:

base_learner* mwt_setup(options_i& options, vw& all)
{
  auto c = scoped_calloc_or_throw<mwt>();
  string s;
  bool exclude_eval = false;
  option_group_definition new_options("Multiworld Testing Options");
  new_options.add(make_option("multiworld_test", s).keep().help("Evaluate features as a policies"))
      .add(make_option("learn", c->num_classes).help("Do Contextual Bandit learning on <n> classes."))
      .add(make_option("exclude_eval", exclude_eval).help("Discard mwt policy features before learning"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("multiworld_test"))
    return nullptr;

  for (size_t i = 0; i < s.size(); i++) c->namespaces[(unsigned char)s[i]] = true;
  c->all = &all;

  calloc_reserve(c->evals, all.length());
  c->evals.end() = c->evals.begin() + all.length();

  all.delete_prediction = delete_scalars;
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  if (c->num_classes > 0)
  {
    c->learn = true;

    if (!options.was_supplied("cb"))
    {
      stringstream ss;
      ss << c->num_classes;
      options.insert("cb", ss.str());
    }
  }

  learner<mwt, example>* l;
  if (c->learn)
    if (exclude_eval)
      l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<true, true, true>,
          predict_or_learn<true, true, false>, 1, prediction_type::scalars);
    else
      l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<true, false, true>,
          predict_or_learn<true, false, false>, 1, prediction_type::scalars);
  else
    l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<false, false, true>,
        predict_or_learn<false, false, false>, 1, prediction_type::scalars);

  l->set_save_load(save_load);
  l->set_finish_example(finish_example);
  l->set_finish(finish);
  return make_base(*l);
}